

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bounding_box.cpp
# Opt level: O1

int __thiscall
ON_BoundingBox::GetClosestPoint
          (ON_BoundingBox *this,ON_Line *line,ON_3dPoint *box_point,double *t0,double *t1)

{
  double dVar1;
  int iVar2;
  bool bVar3;
  ON_3dPoint *pOVar4;
  double *pdVar5;
  double *pdVar6;
  ulong uVar7;
  ON_3dPoint *pOVar8;
  ON_BoundingBox *pOVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  ON_3dVector *pOVar13;
  ulong uVar14;
  long lVar15;
  ON_BoundingBox *this_00;
  int j;
  int iVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  uint uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  double dVar25;
  ON_3dPoint closest;
  ON_Interval pl;
  int ihi [3];
  ON_3dVector n;
  ON_3dVector ProjDir;
  ON_Interval overlap;
  int ilo [3];
  ON_3dPoint center;
  ON_3dPoint cp;
  int local_1ac;
  uint local_17c [3];
  double *local_170;
  ON_3dPoint local_168;
  double *local_150;
  ON_BoundingBox *local_148;
  int local_13c;
  ON_3dPoint *local_138;
  ON_BoundingBox *local_130;
  ulong local_128;
  ulong local_120;
  ON_3dVector local_118;
  int local_100 [4];
  int local_f0;
  int local_ec;
  ON_3dPoint local_e8;
  ON_3dPoint local_c8;
  ON_Interval local_b0;
  int local_a0 [4];
  ulong local_90;
  ulong local_88;
  ulong local_80;
  ON_3dVector local_78 [2];
  ON_3dVector local_48;
  
  local_150 = t1;
  bVar3 = IsNotEmpty(this);
  uVar10 = 0;
  if ((bVar3) && (bVar3 = ON_Line::IsValid(line), uVar10 = 0, bVar3)) {
    pOVar13 = local_78;
    ON_Line::Direction(pOVar13,line);
    dVar25 = ON_3dVector::Length(pOVar13);
    if (dVar25 <= 1.490116119385e-08) {
      ON_Line::PointAt((ON_3dPoint *)local_78,line,0.5);
      if (t0 != (double *)0x0) {
        *t0 = 0.0;
      }
      if (local_150 != (double *)0x0) {
        *local_150 = 1.0;
      }
      ClosestPoint(&local_168,this,(ON_3dPoint *)local_78);
      box_point->z = local_168.z;
      box_point->x = local_168.x;
      box_point->y = local_168.y;
      uVar10 = 1;
      if (((((this->m_min).x <= local_78[0].x) && (local_78[0].x <= (this->m_max).x)) &&
          ((this->m_min).y <= local_78[0].y)) &&
         ((local_78[0].y <= (this->m_max).y && ((this->m_min).z <= local_78[0].z)))) {
        uVar10 = (uint)(local_78[0].z <= (this->m_max).z) * 2 + 1;
      }
    }
    else {
      lVar17 = 0;
      local_138 = box_point;
      do {
        ON_Interval::ON_Interval((ON_Interval *)((long)&local_78[0].x + lVar17));
        lVar17 = lVar17 + 0x10;
      } while (lVar17 != 0x30);
      local_130 = (ON_BoundingBox *)&this->m_max;
      lVar17 = 0;
      local_148 = this;
      do {
        pOVar4 = ON_Line::operator[](line,0);
        iVar12 = (int)lVar17;
        dVar25 = ON_3dPoint::operator[](pOVar4,iVar12);
        pOVar4 = ON_Line::operator[](line,1);
        dVar1 = ON_3dPoint::operator[](pOVar4,iVar12);
        ON_Interval::ON_Interval((ON_Interval *)&local_118,dVar25,dVar1);
        pdVar5 = ON_Interval::operator[]((ON_Interval *)&local_118,0);
        dVar25 = *pdVar5;
        pdVar5 = ON_Interval::operator[]((ON_Interval *)&local_118,1);
        this_00 = local_148;
        if ((dVar25 != *pdVar5) || (NAN(dVar25) || NAN(*pdVar5))) {
          local_168.z = (local_148->m_min).z;
          local_168.x = (local_148->m_min).x;
          local_168.y = (local_148->m_min).y;
          pdVar5 = ON_3dPoint::operator[](&local_168,iVar12);
          dVar25 = ON_Interval::NormalizedParameterAt((ON_Interval *)&local_118,*pdVar5);
          local_e8.z = (local_130->m_min).z;
          local_e8.x = (local_130->m_min).x;
          local_e8.y = (local_130->m_min).y;
          pdVar5 = ON_3dPoint::operator[](&local_e8,iVar12);
          dVar1 = ON_Interval::NormalizedParameterAt((ON_Interval *)&local_118,*pdVar5);
          ON_Interval::ON_Interval((ON_Interval *)&local_c8,dVar25,dVar1);
          uVar20 = local_c8.x._0_4_;
          uVar21 = local_c8.x._4_4_;
          uVar23 = local_c8.y._0_4_;
          uVar24 = local_c8.y._4_4_;
        }
        else {
          local_168.z = (local_148->m_min).z;
          local_168.x = (local_148->m_min).x;
          local_168.y = (local_148->m_min).y;
          pdVar5 = ON_3dPoint::operator[](&local_168,iVar12);
          dVar25 = *pdVar5;
          pdVar5 = ON_Interval::operator[]((ON_Interval *)&local_118,0);
          if (*pdVar5 < dVar25) {
LAB_003e216c:
            uVar20 = 0x9e331dd2;
            uVar21 = 0xffe5f8bd;
            dVar25 = -1.23432101234321e+308;
          }
          else {
            pdVar5 = ON_Interval::operator[]((ON_Interval *)&local_118,0);
            dVar25 = *pdVar5;
            local_e8.x = (local_130->m_min).x;
            local_e8.y = (local_130->m_min).y;
            local_e8.z = (local_130->m_min).z;
            pdVar5 = ON_3dPoint::operator[](&local_e8,iVar12);
            if (*pdVar5 < dVar25) goto LAB_003e216c;
            uVar20 = 0xffffffff;
            uVar21 = 0xffefffff;
            dVar25 = 1.79769313486232e+308;
          }
          ON_Interval::ON_Interval((ON_Interval *)&local_168,(double)CONCAT44(uVar21,uVar20),dVar25)
          ;
          uVar20 = local_168.x._0_4_;
          uVar21 = local_168.x._4_4_;
          uVar23 = local_168.y._0_4_;
          uVar24 = local_168.y._4_4_;
        }
        *(undefined4 *)&pOVar13->x = uVar20;
        *(undefined4 *)((long)&pOVar13->x + 4) = uVar21;
        *(undefined4 *)&pOVar13->y = uVar23;
        *(undefined4 *)((long)&pOVar13->y + 4) = uVar24;
        lVar17 = lVar17 + 1;
        pOVar13 = (ON_3dVector *)&pOVar13->z;
      } while (lVar17 != 3);
      ON_Interval::ON_Interval(&local_b0,-1.79769313486232e+308,1.79769313486232e+308);
      pOVar13 = local_78;
      uVar19 = 0;
      do {
        bVar3 = ON_Interval::Intersection(&local_b0,(ON_Interval *)pOVar13);
        pOVar4 = local_138;
        if (1 < uVar19) break;
        uVar19 = uVar19 + 1;
        pOVar13 = (ON_3dVector *)&pOVar13->z;
      } while (bVar3);
      if (bVar3) {
        ON_Interval::ON_Interval((ON_Interval *)&local_168,0.0,1.0);
        bVar3 = ON_Interval::Intersection(&local_b0,(ON_Interval *)&local_168);
        if (bVar3) {
          if (t0 != (double *)0x0) {
            pdVar5 = ON_Interval::operator[](&local_b0,0);
            *t0 = *pdVar5;
          }
          pdVar5 = local_150;
          if (local_150 != (double *)0x0) {
            pdVar6 = ON_Interval::operator[](&local_b0,1);
            *pdVar5 = *pdVar6;
          }
          pdVar5 = ON_Interval::operator[](&local_b0,0);
          ON_Line::PointAt(&local_168,line,*pdVar5);
          pOVar4->z = local_168.z;
          pOVar4->x = local_168.x;
          pOVar4->y = local_168.y;
          dVar25 = ON_Interval::Length(&local_b0);
          uVar10 = 0.0 < dVar25 | 2;
        }
        else {
          uVar10 = 1;
          pdVar5 = ON_Interval::operator[](&local_b0,1);
          uVar22 = ~(uint)(-(ulong)(*pdVar5 < 0.0) >> 0x20) & 0x3ff00000;
          if (t0 != (double *)0x0) {
            *t0 = (double)((ulong)uVar22 << 0x20);
          }
          if (local_150 != (double *)0x0) {
            *local_150 = (double)((ulong)uVar22 << 0x20);
          }
        }
      }
      else {
        uVar19 = 0;
        do {
          uVar14 = uVar19 + 1;
          uVar7 = 0;
          if (uVar14 != 3) {
            uVar7 = uVar14 & 0xffffffff;
          }
          bVar3 = ON_Interval::Intersection
                            (&local_b0,(ON_Interval *)(&local_78[0].x + uVar7 * 2),
                             (ON_Interval *)
                             ((long)&local_78[0].x + (ulong)(((int)uVar19 + 2U) % 3 << 4)));
          if (!bVar3) {
            local_88 = uVar14;
            ON_3dVector::ON_3dVector((ON_3dVector *)&local_168,0.0,0.0,0.0);
            pdVar5 = ON_3dVector::operator[]((ON_3dVector *)&local_168,(int)uVar19);
            *pdVar5 = 1.0;
            ON_Line::Direction(&local_118,line);
            ON_CrossProduct((ON_3dVector *)&local_e8,&local_118,(ON_3dVector *)&local_168);
            dVar25 = ON_3dVector::Length((ON_3dVector *)&local_e8);
            iVar12 = 10;
            if ((dVar25 != 0.0) || (NAN(dVar25))) {
              ON_3dVector::Unitize((ON_3dVector *)&local_e8);
              local_a0[2] = 0;
              local_a0[0] = 0;
              local_a0[1] = 0;
              local_100[0] = 1;
              local_100[1] = 1;
              local_100[2] = 1;
              local_100[uVar19] = local_a0[uVar19];
              local_f0 = local_100[0];
              local_90 = uVar19;
              if (local_100[0] < 0) {
                lVar17 = 8;
                lVar15 = 0x10;
                iVar12 = -1;
              }
              else {
                local_13c = local_100[1];
                local_80 = (ulong)(uint)local_100[2];
                iVar11 = local_100[2] + 1;
                local_170 = (double *)CONCAT44(local_170._4_4_,0xffffffff);
                dVar25 = 0.0;
                local_128 = CONCAT44(local_128._4_4_,0xffffffff);
                local_120 = CONCAT44(local_120._4_4_,0xffffffff);
                local_100[3] = local_a0[1];
                local_ec = local_a0[2];
                iVar16 = local_a0[2];
                iVar12 = 0;
                do {
                  if (local_100[3] <= local_13c) {
                    lVar17 = 0;
                    iVar2 = local_100[3];
                    if (0 < iVar12) {
                      lVar17 = 0x18;
                    }
                    do {
                      if (iVar16 <= (int)local_80) {
                        lVar15 = 8;
                        if (0 < iVar2) {
                          lVar15 = 0x20;
                        }
                        do {
                          local_c8.x = *(double *)((long)&(local_148->m_min).x + lVar17);
                          local_c8.y = *(double *)((long)&(local_148->m_min).x + lVar15);
                          pOVar4 = &local_148->m_min;
                          if (0 < iVar16) {
                            pOVar4 = &local_148->m_max;
                          }
                          local_c8.z = pOVar4->z;
                          ON_3dPoint::operator-(&local_118,&local_c8,&line->from);
                          dVar1 = ON_3dVector::operator*((ON_3dVector *)&local_e8,&local_118);
                          if (((dVar25 == 0.0) && (!NAN(dVar25))) || (ABS(dVar1) < ABS(dVar25))) {
                            local_120 = CONCAT44(local_120._4_4_,iVar16);
                            local_128 = CONCAT44(local_128._4_4_,iVar2);
                            local_170 = (double *)CONCAT44(local_170._4_4_,iVar12);
                            dVar25 = dVar1;
                          }
                          iVar16 = iVar16 + 1;
                        } while (iVar11 != iVar16);
                      }
                      bVar3 = iVar2 != local_13c;
                      iVar16 = local_ec;
                      iVar2 = iVar2 + 1;
                    } while (bVar3);
                  }
                  bVar3 = iVar12 != local_f0;
                  iVar12 = iVar12 + 1;
                } while (bVar3);
                lVar17 = 8;
                if (0 < (int)local_128) {
                  lVar17 = 0x20;
                }
                lVar15 = 0x10;
                if (0 < (int)local_120) {
                  lVar15 = 0x28;
                }
                this_00 = local_148;
                iVar12 = (int)local_170;
              }
              if (iVar12 < 0) {
                iVar12 = 1;
                local_1ac = 0;
              }
              else {
                pOVar9 = local_130;
                if (iVar12 == 0) {
                  pOVar9 = this_00;
                }
                local_118.x = (pOVar9->m_min).x;
                local_118.y = *(double *)((long)&(this_00->m_min).x + lVar17);
                local_118.z = *(double *)((long)&(this_00->m_min).x + lVar15);
                iVar12 = (int)local_90;
                dVar25 = ON_3dPoint::operator[](&line->from,iVar12);
                pdVar5 = ON_3dPoint::operator[]((ON_3dPoint *)&local_118,iVar12);
                *pdVar5 = dVar25;
                ON_Line::Direction((ON_3dVector *)&local_c8,line);
                pdVar5 = ON_3dVector::operator[]((ON_3dVector *)&local_c8,iVar12);
                *pdVar5 = 0.0;
                ON_3dPoint::operator-(&local_48,(ON_3dPoint *)&local_118,&line->from);
                dVar25 = ON_3dVector::operator*(&local_48,(ON_3dVector *)&local_c8);
                dVar1 = ON_3dVector::LengthSquared((ON_3dVector *)&local_c8);
                dVar25 = dVar25 / dVar1;
                ON_Line::PointAt((ON_3dPoint *)&local_48,line,dVar25);
                iVar12 = 0;
                if ((0.0 <= dVar25) && (dVar25 <= 1.0)) {
                  iVar16 = (int)local_90;
                  local_170 = (double *)ON_3dPoint::operator[](&this_00->m_min,iVar16);
                  pdVar5 = ON_3dPoint::operator[]((ON_3dPoint *)&local_48,iVar16);
                  if ((double)local_170 <= *pdVar5) {
                    local_170 = ON_3dPoint::operator[]((ON_3dPoint *)&local_48,iVar16);
                    local_170 = (double *)*local_170;
                    dVar1 = ON_3dPoint::operator[](&local_130->m_min,iVar16);
                    if ((double)local_170 <= dVar1) {
                      if (t0 != (double *)0x0) {
                        *t0 = dVar25;
                      }
                      if (local_150 != (double *)0x0) {
                        *local_150 = dVar25;
                      }
                      pdVar5 = ON_3dPoint::operator[]((ON_3dPoint *)&local_48,iVar16);
                      dVar25 = *pdVar5;
                      pdVar5 = ON_3dPoint::operator[]((ON_3dPoint *)&local_118,iVar16);
                      *pdVar5 = dVar25;
                      local_138->x = local_118.x;
                      local_138->y = local_118.y;
                      local_138->z = local_118.z;
                      iVar12 = 1;
                      local_1ac = 1;
                    }
                  }
                }
              }
            }
            uVar14 = local_88;
            if ((iVar12 != 10) && (iVar12 != 0)) {
              return local_1ac;
            }
          }
          uVar19 = uVar14;
        } while (uVar14 != 3);
        local_17c[0] = 0;
        uVar19 = 0;
        local_170 = &(this_00->m_max).z;
        do {
          lVar17 = 0;
          if ((int)uVar19 == 1) {
            lVar17 = 0x18;
          }
          local_17c[1] = 0;
          uVar7 = 0;
          local_128 = uVar19;
          do {
            lVar15 = 8;
            if ((int)uVar7 == 1) {
              lVar15 = 0x20;
            }
            local_17c[2] = 0;
            local_120 = uVar7;
            do {
              uVar10 = local_17c[2];
              local_168.x = *(double *)((long)&(local_148->m_min).x + lVar17);
              local_168.y = *(double *)((long)&(local_148->m_min).x + lVar15);
              pdVar5 = &(this_00->m_min).z;
              if (local_17c[2] == 1) {
                pdVar5 = local_170;
              }
              local_168.z = *pdVar5;
              ON_Line::ClosestPointTo(line,&local_168,&local_c8.x);
              ON_Line::PointAt(&local_e8,line,local_c8.x);
              ON_3dPoint::operator-(&local_118,&local_e8,&local_168);
              lVar18 = 0;
              do {
                uVar22 = local_17c[lVar18];
                pdVar5 = ON_3dVector::operator[](&local_118,(int)lVar18);
                pOVar4 = local_138;
                bVar3 = 0.0 <= *pdVar5;
                if (uVar22 == 0) {
                  bVar3 = *pdVar5 <= 0.0;
                }
              } while ((lVar18 == 0) && (lVar18 = 1, bVar3));
              if (bVar3) {
                if (t0 != (double *)0x0) {
                  *t0 = local_c8.x;
                }
                if (local_150 != (double *)0x0) {
                  *local_150 = local_c8.x;
                }
                local_138->z = local_168.z;
                local_138->x = local_168.x;
                local_138->y = local_168.y;
                local_1ac = 1;
              }
              if (bVar3) {
                return local_1ac;
              }
              local_17c[2] = uVar10 + 1;
            } while (uVar10 == 0);
            local_17c[1] = (int)local_120 + 1;
            uVar7 = (ulong)local_17c[1];
          } while ((int)local_120 == 0);
          local_17c[0] = (int)local_128 + 1;
          uVar19 = (ulong)local_17c[0];
        } while ((int)local_128 == 0);
        iVar12 = 0;
        do {
          pOVar8 = ON_Line::operator[](line,iVar12);
          ClosestPoint(&local_e8,local_148,pOVar8);
          local_168.z = local_e8.z;
          local_168.x = local_e8.x;
          local_168.y = local_e8.y;
          pOVar8 = ON_Line::operator[](line,iVar12);
          ON_3dPoint::operator-((ON_3dVector *)&local_e8,&local_168,pOVar8);
          ON_Line::Direction(&local_118,line);
          dVar25 = ON_3dVector::operator*((ON_3dVector *)&local_e8,&local_118);
          if (((iVar12 == 0) && (dVar25 <= 0.0)) || ((bVar3 = true, iVar12 != 0 && (0.0 <= dVar25)))
             ) {
            if (t0 != (double *)0x0) {
              *t0 = (double)iVar12;
            }
            if (local_150 != (double *)0x0) {
              *local_150 = (double)iVar12;
            }
            pOVar4->z = local_168.z;
            *(undefined4 *)&pOVar4->x = local_168.x._0_4_;
            *(undefined4 *)((long)&pOVar4->x + 4) = local_168.x._4_4_;
            *(undefined4 *)&pOVar4->y = local_168.y._0_4_;
            *(undefined4 *)((long)&pOVar4->y + 4) = local_168.y._4_4_;
            local_1ac = 1;
            bVar3 = false;
          }
          if (!bVar3) {
            return local_1ac;
          }
          iVar12 = iVar12 + 1;
        } while (iVar12 == 1);
        uVar10 = 0;
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_bounding_box.cpp"
                   ,0x6e6,"","Should never get here.");
      }
    }
  }
  return uVar10;
}

Assistant:

int ON_BoundingBox::GetClosestPoint( 
  const ON_Line& line, ON_3dPoint& box_point, double* t0, double* t1
  ) const
{
  if(!IsValid() || !line.IsValid()) 
		return 0;			
	
	ON_3dPoint closest;
	
	if(line.Direction().Length()<=ON_SQRT_EPSILON){
		ON_3dPoint center = line.PointAt(.5);
		if(t0) *t0 = 0.0;
		if(t1) *t1 = 1.0;
		box_point = ClosestPoint(center);
		return IsPointIn( center )? 3 : 1;
	}

	ON_Interval over[3];			//parameter overlap for each direction

	for(int j=0; j<3; j++){
		ON_Interval pl( line[0][j], line[1][j]);
		if( pl[0]!=pl[1])
			over[j]= ON_Interval(	pl.NormalizedParameterAt(Min()[j]),
														pl.NormalizedParameterAt(Max()[j])  );
		else 
			if( Min()[j]<=pl[0] && pl[0]<=Max()[j] )
				over[j]=ON_Interval(-ON_DBL_MAX, ON_DBL_MAX);
			else 
				over[j]=ON_Interval(ON_UNSET_VALUE, ON_UNSET_VALUE);
	}



	// Step 1.  Check for an intersection of the infinite line with the box
	ON_Interval overlap(-ON_DBL_MAX, ON_DBL_MAX);	
	bool nonempty=true;
  int i;
	for( i=0;i<3 && nonempty;i++)
		nonempty = overlap.Intersection(over[i]);
	
	if(nonempty){	// infinite line intersects box
		if( overlap.Intersection( ON_Interval(0,1) ) ){
			// Box & Line segment  intersect
			if(t0) *t0 = overlap[0];
			if(t1) *t1 = overlap[1];
			box_point = line.PointAt(overlap[0]);
			return (overlap.Length()>0)? 3 : 2;
		}
		// closest point is at end of line segment
		double EndInd=(overlap[1]<0)? 0.0: 1.0;
		if(t0) *t0 = EndInd;
		if(t1) *t1 = EndInd;
		return 1;
	}


	//  Step 2.  Check for closest point on box edge and line segment interior
	//   In this case when we project orthogonal to the box edge we get a line 
	//   in the plane that doesn't intersect the 2d-box in the plane.  The projection
  //   of the 3d closest point is the closest point of this 2d closest point problem.
	int k[3];
	for(i=0; i<3; i++)
  {
		// Project box and line onto coord plane with normal Unit(i).

		if(!overlap.Intersection( over[(i+1)%3], over[(i+2)%3] )){	
			// Projected line doesnt intersect the projexted box.  
			// Find the closest  vertex of the projected box.  
			ON_3dVector StdUnit(0,0,0);
			StdUnit[i]=1.0;
			ON_3dVector n = ON_CrossProduct(line.Direction(), StdUnit);
			if(n.Length()==0)
				continue;
			n.Unitize();
			int ilo[3]={0,0,0};
			int ihi[3]={1,1,1};
      int imin[3]={-1,-1,-1};
			double amin=0.0;
			ihi[i]=ilo[i];
			for(k[0]=ilo[0];  k[0]<=ihi[0]; k[0]++)
				for(k[1]=ilo[1];  k[1]<=ihi[1]; k[1]++)
					for(k[2]=ilo[2];  k[2]<=ihi[2]; k[2]++){
						double a = n*(Corner(k[0],k[1],k[2]) - line.from);
						if(amin == 0.0 || fabs(a)<fabs(amin))
            {
							amin= a;
							imin[0]=k[0]; imin[1]=k[1]; imin[2]=k[2];
						}
			}
      if ( imin[0] < 0 )
      {
        return 0;
      }
			ON_3dPoint vertex = Corner(imin[0],imin[1],imin[2]);
			vertex[i] = line.from[i];
			// Solve for 2d-closest point between closest corner and projected line 
			ON_3dVector ProjDir = line.Direction();
			ProjDir[i]=0.0;
			double t = ( vertex - line.from)*ProjDir / ProjDir.LengthSquared();
			ON_3dPoint cp = line.PointAt(t);
			if( 0<=t && t<=1 && m_min[i]<=cp[i] &&cp[i]<= m_max[i] ){
				if(t0) *t0 = t;		// found the  closest point 
				if(t1) *t1 = t;
				vertex[i] =  cp[i];
				box_point = vertex;
				return 1;
			}
		}
	}

	//Step 3. Check each Corner of the box for closest points
	for( k[0]=0; k[0]<2; k[0]++)
		for( k[1]=0; k[1]<2; k[1]++)
			for( k[2]=0; k[2]<2; k[2]++){
				ON_3dPoint corner = Corner(k[0],k[1],k[2]);
				double tstar;
				line.ClosestPointTo( corner, &tstar );
				ON_3dPoint cp = line.PointAt( tstar);
				ON_3dVector disp = cp - corner;
				bool InNCone=true;
				for(int j=0;j<2 && InNCone;j++){
					InNCone = InNCone && ( k[j] )? disp[j]>=0 : disp[j]<=0  ;
				}
				if(InNCone){
					if(t0) *t0 = tstar;
					if(t1) *t1 = tstar;
					box_point = corner;
					return 1;
				} 
	}

	//Step 4. Closest point is at a line end
	for(i=0; i<2; i++){
		closest = ClosestPoint(line[i]);
		double dot = (closest - line[i]) * line.Direction();
		if( (i==0 && dot<= 0) || (i==1 && dot>=0) )
    {
			if(t0) *t0 = i;
			if(t1) *t1 = i;
			box_point = closest;
			return 1;
		}
	}

  ON_ERROR("Should never get here.");
	return 0;  
}